

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,ZoneInfoSource *zip)

{
  Transition *pTVar1;
  bool bVar2;
  uint_fast8_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  pointer __n;
  char *pcVar6;
  undefined4 extraout_var_01;
  reference pvVar7;
  reference rhs;
  int_fast32_t iVar8;
  reference pvVar9;
  char *pcVar10;
  size_type sVar11;
  ulong uVar12;
  Transition *pTVar13;
  rep rVar14;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> a;
  fields fVar15;
  byte local_2d0;
  byte local_2cf;
  int_fast32_t local_290;
  duration<long,_std::ratio<1L,_1L>_> local_250;
  absolute_lookup local_248;
  duration<long,_std::ratio<1L,_1L>_> local_228;
  absolute_lookup local_220;
  reference local_200;
  TransitionType *tt;
  iterator __end3;
  iterator __begin3;
  vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  *__range3;
  absolute_lookup local_1d8;
  absolute_lookup local_1b8;
  detail *local_198;
  int_least64_t iStack_190;
  fields local_188;
  reference local_178;
  Transition *tr_2;
  size_t i_3;
  TransitionType *ttp;
  const_iterator local_158;
  __normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_*,_std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>_>
  local_150;
  reference local_148;
  Transition *tr_1;
  reference pvStack_138;
  uint_fast8_t type_index;
  Transition *last;
  const_iterator local_128;
  __normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_*,_std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>_>
  local_120;
  reference local_118;
  Transition *tr;
  int local_f0;
  anon_class_1_0_00000001 local_ea;
  byte local_e9;
  int c;
  anon_class_1_0_00000001 get_char;
  uint_fast8_t index;
  size_t i_2;
  size_t i_1;
  bool seen_type_0;
  size_type sStack_d0;
  size_t i;
  char *bp;
  allocator_type local_a9;
  undefined1 local_a8 [8];
  vector<char,_std::allocator<char>_> tbuf;
  size_t len;
  size_t time_len;
  Header hdr;
  char local_48;
  tzhead tzh;
  ZoneInfoSource *zip_local;
  TimeZoneInfo *this_local;
  
  iVar4 = (*zip->_vptr_ZoneInfoSource[2])(zip,(undefined1 *)((long)&hdr.ttisutcnt + 4),0x2c);
  if (CONCAT44(extraout_var,iVar4) != 0x2c) {
    return false;
  }
  iVar4 = strncmp((char *)((long)&hdr.ttisutcnt + 4),"TZif",4);
  if (iVar4 != 0) {
    return false;
  }
  bVar2 = cctz::anon_unknown_0::Header::Build
                    ((Header *)&time_len,(tzhead *)((long)&hdr.ttisutcnt + 4));
  if (!bVar2) {
    return false;
  }
  len = 4;
  if (local_48 != '\0') {
    sVar5 = cctz::anon_unknown_0::Header::DataLength((Header *)&time_len,4);
    iVar4 = (*zip->_vptr_ZoneInfoSource[3])(zip,sVar5);
    if (iVar4 != 0) {
      return false;
    }
    iVar4 = (*zip->_vptr_ZoneInfoSource[2])(zip,(undefined1 *)((long)&hdr.ttisutcnt + 4),0x2c);
    if (CONCAT44(extraout_var_00,iVar4) != 0x2c) {
      return false;
    }
    iVar4 = strncmp((char *)((long)&hdr.ttisutcnt + 4),"TZif",4);
    if (iVar4 != 0) {
      return false;
    }
    if (local_48 == '\0') {
      return false;
    }
    bVar2 = cctz::anon_unknown_0::Header::Build
                      ((Header *)&time_len,(tzhead *)((long)&hdr.ttisutcnt + 4));
    if (!bVar2) {
      return false;
    }
    len = 8;
  }
  if (hdr.timecnt == 0) {
    return false;
  }
  if (hdr.charcnt != 0) {
    return false;
  }
  if ((hdr.leapcnt != 0) && (hdr.leapcnt != hdr.timecnt)) {
    return false;
  }
  if ((hdr.ttisstdcnt != 0) && (hdr.ttisstdcnt != hdr.timecnt)) {
    return false;
  }
  __n = (pointer)cctz::anon_unknown_0::Header::DataLength((Header *)&time_len,len);
  tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __n;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_a8,(size_type)__n,&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_a8);
  iVar4 = (*zip->_vptr_ZoneInfoSource[2])
                    (zip,pcVar6,
                     tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if ((pointer)CONCAT44(extraout_var_01,iVar4) ==
      tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    i = (size_t)std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)local_a8);
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::reserve(&this->transitions_,time_len + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::resize(&this->transitions_,time_len);
    for (sStack_d0 = 0; sStack_d0 != time_len; sStack_d0 = sStack_d0 + 1) {
      if (len == 4) {
        local_290 = cctz::anon_unknown_0::Decode32((char *)i);
      }
      else {
        local_290 = cctz::anon_unknown_0::Decode64((char *)i);
      }
      pvVar7 = std::
               vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ::operator[](&this->transitions_,sStack_d0);
      pvVar7->unix_time = local_290;
      i = len + i;
      if (sStack_d0 != 0) {
        pvVar7 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::operator[](&this->transitions_,sStack_d0 - 1);
        rhs = std::
              vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
              ::operator[](&this->transitions_,sStack_d0);
        bVar2 = Transition::ByUnixTime::operator()((ByUnixTime *)((long)&i_1 + 7),pvVar7,rhs);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          this_local._7_1_ = false;
          goto LAB_0094e5aa;
        }
      }
    }
    i_1._6_1_ = 0;
    for (i_2 = 0; sVar5 = i, i_2 != time_len; i_2 = i_2 + 1) {
      i = i + 1;
      uVar3 = cctz::anon_unknown_0::Decode8((char *)sVar5);
      pvVar7 = std::
               vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ::operator[](&this->transitions_,i_2);
      pvVar7->type_index = uVar3;
      pvVar7 = std::
               vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ::operator[](&this->transitions_,i_2);
      if (hdr.timecnt <= pvVar7->type_index) {
        this_local._7_1_ = false;
        goto LAB_0094e5aa;
      }
      pvVar7 = std::
               vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ::operator[](&this->transitions_,i_2);
      if (pvVar7->type_index == '\0') {
        i_1._6_1_ = 1;
      }
    }
    std::
    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
    ::reserve(&this->transition_types_,hdr.timecnt + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
    ::resize(&this->transition_types_,hdr.timecnt);
    for (_c = 0; _c != hdr.timecnt; _c = _c + 1) {
      iVar8 = cctz::anon_unknown_0::Decode32((char *)i);
      pvVar9 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::operator[](&this->transition_types_,_c);
      pvVar9->utc_offset = (int_least32_t)iVar8;
      pvVar9 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::operator[](&this->transition_types_,_c);
      if ((0x1517f < pvVar9->utc_offset) ||
         (pvVar9 = std::
                   vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                   ::operator[](&this->transition_types_,_c), pvVar9->utc_offset < -0x1517f)) {
        this_local._7_1_ = false;
        goto LAB_0094e5aa;
      }
      pcVar6 = (char *)(i + 4);
      i = i + 5;
      uVar3 = cctz::anon_unknown_0::Decode8(pcVar6);
      pvVar9 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::operator[](&this->transition_types_,_c);
      sVar5 = i;
      pvVar9->is_dst = uVar3 != '\0';
      i = i + 1;
      uVar3 = cctz::anon_unknown_0::Decode8((char *)sVar5);
      pvVar9 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::operator[](&this->transition_types_,_c);
      pvVar9->abbr_index = uVar3;
      pvVar9 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::operator[](&this->transition_types_,_c);
      if (hdr.typecnt <= pvVar9->abbr_index) {
        this_local._7_1_ = false;
        goto LAB_0094e5aa;
      }
    }
    this->default_transition_type_ = '\0';
    if (((i_1._6_1_ & 1) != 0) && (time_len != 0)) {
      local_e9 = 0;
      pvVar9 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::operator[](&this->transition_types_,0);
      if ((pvVar9->is_dst & 1U) != 0) {
        pvVar7 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::operator[](&this->transitions_,0);
        local_e9 = pvVar7->type_index;
        while( true ) {
          local_2cf = 0;
          if (local_e9 != 0) {
            pvVar9 = std::
                     vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                     ::operator[](&this->transition_types_,(ulong)local_e9);
            local_2cf = pvVar9->is_dst;
          }
          if ((local_2cf & 1) == 0) break;
          local_e9 = local_e9 - 1;
        }
      }
      while( true ) {
        local_2d0 = 0;
        if (local_e9 != hdr.timecnt) {
          pvVar9 = std::
                   vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                   ::operator[](&this->transition_types_,(ulong)local_e9);
          local_2d0 = pvVar9->is_dst;
        }
        if ((local_2d0 & 1) == 0) break;
        local_e9 = local_e9 + 1;
      }
      if (local_e9 != hdr.timecnt) {
        this->default_transition_type_ = local_e9;
      }
    }
    std::__cxx11::string::reserve((ulong)&this->abbreviations_);
    std::__cxx11::string::assign((char *)&this->abbreviations_,i);
    pcVar6 = (char *)(hdr.ttisstdcnt + hdr.leapcnt + (len + 4) * hdr.charcnt + hdr.typecnt + i);
    i = (size_t)pcVar6;
    pcVar10 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)local_a8);
    sVar11 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)local_a8);
    if (pcVar6 != pcVar10 + sVar11) {
      __assert_fail("bp == tbuf.data() + tbuf.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                    ,0x2d9,"bool absl::time_internal::cctz::TimeZoneInfo::Load(ZoneInfoSource *)");
    }
    std::__cxx11::string::clear();
    if (local_48 != '\0') {
      iVar4 = Load::anon_class_1_0_00000001::operator()(&local_ea,zip);
      if (iVar4 != 10) {
        this_local._7_1_ = false;
        goto LAB_0094e5aa;
      }
      local_f0 = Load::anon_class_1_0_00000001::operator()(&local_ea,zip);
      while (local_f0 != 10) {
        if (local_f0 == -1) {
          this_local._7_1_ = false;
          goto LAB_0094e5aa;
        }
        std::__cxx11::string::push_back((char)this + -0x80);
        local_f0 = Load::anon_class_1_0_00000001::operator()(&local_ea,zip);
      }
    }
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) != 0) {
      (*zip->_vptr_ZoneInfoSource[4])(&tr);
      std::__cxx11::string::operator=((string *)&this->version_,(string *)&tr);
      std::__cxx11::string::~string((string *)&tr);
    }
    bVar2 = std::
            vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
            ::empty(&this->transitions_);
    if ((bVar2) ||
       (pvVar7 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::front(&this->transitions_), -1 < pvVar7->unix_time)) {
      last = (Transition *)
             std::
             vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             ::begin(&this->transitions_);
      __gnu_cxx::
      __normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_const*,std::vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>>
      ::__normal_iterator<absl::lts_20250127::time_internal::cctz::Transition*>
                ((__normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_const*,std::vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>>
                  *)&local_128,
                 (__normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_*,_std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>_>
                  *)&last);
      local_120._M_current =
           (Transition *)
           std::
           vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ::emplace<>(&this->transitions_,local_128);
      local_118 = __gnu_cxx::
                  __normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_*,_std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>_>
                  ::operator*(&local_120);
      local_118->unix_time = -0x800000000000000;
      local_118->type_index = this->default_transition_type_;
    }
    bVar2 = ExtendTransitions(this);
    if (bVar2) {
      pvStack_138 = std::
                    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                    ::back(&this->transitions_);
      if (pvStack_138->unix_time < 0) {
        tr_1._7_1_ = pvStack_138->type_index;
        ttp = (TransitionType *)
              std::
              vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
              ::end(&this->transitions_);
        __gnu_cxx::
        __normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_const*,std::vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>>
        ::__normal_iterator<absl::lts_20250127::time_internal::cctz::Transition*>
                  ((__normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_const*,std::vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>>
                    *)&local_158,
                   (__normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_*,_std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>_>
                    *)&ttp);
        local_150._M_current =
             (Transition *)
             std::
             vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             ::emplace<>(&this->transitions_,local_158);
        local_148 = __gnu_cxx::
                    __normal_iterator<absl::lts_20250127::time_internal::cctz::Transition_*,_std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>_>
                    ::operator*(&local_150);
        local_148->unix_time = 0x7fffffff;
        local_148->type_index = tr_1._7_1_;
      }
      i_3 = (size_t)std::
                    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                    ::operator[](&this->transition_types_,(ulong)this->default_transition_type_);
      for (tr_2 = (Transition *)0x0; pTVar1 = tr_2,
          pTVar13 = (Transition *)
                    std::
                    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                    ::size(&this->transitions_), pTVar1 != pTVar13;
          tr_2 = (Transition *)((long)&tr_2->unix_time + 1)) {
        local_178 = std::
                    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                    ::operator[](&this->transitions_,(size_type)tr_2);
        sVar5 = i_3;
        LocalTime(&local_1b8,this,local_178->unix_time,(TransitionType *)i_3);
        local_198 = (detail *)local_1b8.cs.f_.y;
        iStack_190._0_1_ = local_1b8.cs.f_.m;
        iStack_190._1_1_ = local_1b8.cs.f_.d;
        iStack_190._2_1_ = local_1b8.cs.f_.hh;
        iStack_190._3_1_ = local_1b8.cs.f_.mm;
        iStack_190._4_1_ = local_1b8.cs.f_.ss;
        iStack_190._5_3_ = local_1b8.cs.f_._13_3_;
        a.f_.m = '\x01';
        a.f_.d = '\0';
        a.f_.hh = '\0';
        a.f_.mm = '\0';
        a.f_.ss = '\0';
        a.f_._13_3_ = 0;
        a.f_.y._0_1_ = local_1b8.cs.f_.m;
        a.f_.y._1_1_ = local_1b8.cs.f_.d;
        a.f_.y._2_1_ = local_1b8.cs.f_.hh;
        a.f_.y._3_1_ = local_1b8.cs.f_.mm;
        a.f_.y._4_1_ = local_1b8.cs.f_.ss;
        a.f_.y._5_3_ = local_1b8.cs.f_._13_3_;
        fVar15 = (fields)detail::operator-((detail *)local_1b8.cs.f_.y,a,sVar5);
        local_188.y = fVar15.y;
        local_188._8_8_ = fVar15._8_8_;
        (local_178->prev_civil_sec).f_.y = local_188.y;
        (local_178->prev_civil_sec).f_.m = local_188.m;
        (local_178->prev_civil_sec).f_.d = local_188.d;
        (local_178->prev_civil_sec).f_.hh = local_188.hh;
        (local_178->prev_civil_sec).f_.mm = local_188.mm;
        (local_178->prev_civil_sec).f_.ss = local_188.ss;
        *(undefined3 *)&(local_178->prev_civil_sec).f_.field_0xd = local_188._13_3_;
        local_188 = fVar15;
        i_3 = (size_t)std::
                      vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                      ::operator[](&this->transition_types_,(ulong)local_178->type_index);
        LocalTime(&local_1d8,this,local_178->unix_time,(TransitionType *)i_3);
        (local_178->civil_sec).f_.y = local_1d8.cs.f_.y;
        (local_178->civil_sec).f_.m = local_1d8.cs.f_.m;
        (local_178->civil_sec).f_.d = local_1d8.cs.f_.d;
        (local_178->civil_sec).f_.hh = local_1d8.cs.f_.hh;
        (local_178->civil_sec).f_.mm = local_1d8.cs.f_.mm;
        (local_178->civil_sec).f_.ss = local_1d8.cs.f_.ss;
        *(undefined3 *)&(local_178->civil_sec).f_.field_0xd = local_1d8.cs.f_._13_3_;
        if (tr_2 != (Transition *)0x0) {
          pvVar7 = std::
                   vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ::operator[](&this->transitions_,(size_type)&tr_2[-1].prev_civil_sec.f_.field_0xf
                               );
          bVar2 = Transition::ByCivilTime::operator()
                            ((ByCivilTime *)((long)&__range3 + 7),pvVar7,local_178);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            this_local._7_1_ = false;
            goto LAB_0094e5aa;
          }
        }
      }
      __end3 = std::
               vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ::begin(&this->transition_types_);
      tt = (TransitionType *)
           std::
           vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
           ::end(&this->transition_types_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<absl::lts_20250127::time_internal::cctz::TransitionType_*,_std::vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>_>
                                         *)&tt), bVar2) {
        local_200 = __gnu_cxx::
                    __normal_iterator<absl::lts_20250127::time_internal::cctz::TransitionType_*,_std::vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>_>
                    ::operator*(&__end3);
        local_228 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::max();
        rVar14 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_228);
        LocalTime(&local_220,this,rVar14,local_200);
        (local_200->civil_max).f_.y = local_220.cs.f_.y;
        (local_200->civil_max).f_.m = local_220.cs.f_.m;
        (local_200->civil_max).f_.d = local_220.cs.f_.d;
        (local_200->civil_max).f_.hh = local_220.cs.f_.hh;
        (local_200->civil_max).f_.mm = local_220.cs.f_.mm;
        (local_200->civil_max).f_.ss = local_220.cs.f_.ss;
        *(undefined3 *)&(local_200->civil_max).f_.field_0xd = local_220.cs.f_._13_3_;
        local_250 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::min();
        rVar14 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_250);
        LocalTime(&local_248,this,rVar14,local_200);
        (local_200->civil_min).f_.y = local_248.cs.f_.y;
        (local_200->civil_min).f_.m = local_248.cs.f_.m;
        (local_200->civil_min).f_.d = local_248.cs.f_.d;
        (local_200->civil_min).f_.hh = local_248.cs.f_.hh;
        (local_200->civil_min).f_.mm = local_248.cs.f_.mm;
        (local_200->civil_min).f_.ss = local_248.cs.f_.ss;
        *(undefined3 *)&(local_200->civil_min).f_.field_0xd = local_248.cs.f_._13_3_;
        __gnu_cxx::
        __normal_iterator<absl::lts_20250127::time_internal::cctz::TransitionType_*,_std::vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
      ::shrink_to_fit(&this->transitions_);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0094e5aa:
  bp._0_4_ = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_a8)
  ;
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::Load(ZoneInfoSource* zip) {
  // Read and validate the header.
  tzhead tzh;
  if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
  if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
    return false;
  Header hdr;
  if (!hdr.Build(tzh)) return false;
  std::size_t time_len = 4;
  if (tzh.tzh_version[0] != '\0') {
    // Skip the 4-byte data.
    if (zip->Skip(hdr.DataLength(time_len)) != 0) return false;
    // Read and validate the header for the 8-byte data.
    if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
    if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
      return false;
    if (tzh.tzh_version[0] == '\0') return false;
    if (!hdr.Build(tzh)) return false;
    time_len = 8;
  }
  if (hdr.typecnt == 0) return false;
  if (hdr.leapcnt != 0) {
    // This code assumes 60-second minutes so we do not want
    // the leap-second encoded zoneinfo. We could reverse the
    // compensation, but the "right" encoding is rarely used
    // so currently we simply reject such data.
    return false;
  }
  if (hdr.ttisstdcnt != 0 && hdr.ttisstdcnt != hdr.typecnt) return false;
  if (hdr.ttisutcnt != 0 && hdr.ttisutcnt != hdr.typecnt) return false;

  // Read the data into a local buffer.
  std::size_t len = hdr.DataLength(time_len);
  std::vector<char> tbuf(len);
  if (zip->Read(tbuf.data(), len) != len) return false;
  const char* bp = tbuf.data();

  // Decode and validate the transitions.
  transitions_.reserve(hdr.timecnt + 2);
  transitions_.resize(hdr.timecnt);
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].unix_time = (time_len == 4) ? Decode32(bp) : Decode64(bp);
    bp += time_len;
    if (i != 0) {
      // Check that the transitions are ordered by time (as zic guarantees).
      if (!Transition::ByUnixTime()(transitions_[i - 1], transitions_[i]))
        return false;  // out of order
    }
  }
  bool seen_type_0 = false;
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].type_index = Decode8(bp++);
    if (transitions_[i].type_index >= hdr.typecnt) return false;
    if (transitions_[i].type_index == 0) seen_type_0 = true;
  }

  // Decode and validate the transition types.
  transition_types_.reserve(hdr.typecnt + 2);
  transition_types_.resize(hdr.typecnt);
  for (std::size_t i = 0; i != hdr.typecnt; ++i) {
    transition_types_[i].utc_offset =
        static_cast<std::int_least32_t>(Decode32(bp));
    if (transition_types_[i].utc_offset >= kSecsPerDay ||
        transition_types_[i].utc_offset <= -kSecsPerDay)
      return false;
    bp += 4;
    transition_types_[i].is_dst = (Decode8(bp++) != 0);
    transition_types_[i].abbr_index = Decode8(bp++);
    if (transition_types_[i].abbr_index >= hdr.charcnt) return false;
  }

  // Determine the before-first-transition type.
  default_transition_type_ = 0;
  if (seen_type_0 && hdr.timecnt != 0) {
    std::uint_fast8_t index = 0;
    if (transition_types_[0].is_dst) {
      index = transitions_[0].type_index;
      while (index != 0 && transition_types_[index].is_dst) --index;
    }
    while (index != hdr.typecnt && transition_types_[index].is_dst) ++index;
    if (index != hdr.typecnt) default_transition_type_ = index;
  }

  // Copy all the abbreviations.
  abbreviations_.reserve(hdr.charcnt + 10);
  abbreviations_.assign(bp, hdr.charcnt);
  bp += hdr.charcnt;

  // Skip the unused portions. We've already dispensed with leap-second
  // encoded zoneinfo. The ttisstd/ttisgmt indicators only apply when
  // interpreting a POSIX spec that does not include start/end rules, and
  // that isn't the case here (see "zic -p").
  bp += (time_len + 4) * hdr.leapcnt;  // leap-time + TAI-UTC
  bp += 1 * hdr.ttisstdcnt;            // UTC/local indicators
  bp += 1 * hdr.ttisutcnt;             // standard/wall indicators
  assert(bp == tbuf.data() + tbuf.size());

  future_spec_.clear();
  if (tzh.tzh_version[0] != '\0') {
    // Snarf up the NL-enclosed future POSIX spec. Note
    // that version '3' files utilize an extended format.
    auto get_char = [](ZoneInfoSource* azip) -> int {
      unsigned char ch;  // all non-EOF results are positive
      return (azip->Read(&ch, 1) == 1) ? ch : EOF;
    };
    if (get_char(zip) != '\n') return false;
    for (int c = get_char(zip); c != '\n'; c = get_char(zip)) {
      if (c == EOF) return false;
      future_spec_.push_back(static_cast<char>(c));
    }
  }

  // We don't check for EOF so that we're forwards compatible.

  // If we did not find version information during the standard loading
  // process (as of tzh_version '3' that is unsupported), then ask the
  // ZoneInfoSource for any out-of-bound version string it may be privy to.
  if (version_.empty()) {
    version_ = zip->Version();
  }

  // Ensure that there is always a transition in the first half of the
  // time line (the second half is handled below) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  if (transitions_.empty() || transitions_.front().unix_time >= 0) {
    Transition& tr(*transitions_.emplace(transitions_.begin()));
    tr.unix_time = -(1LL << 59);  // -18267312070-10-26T17:01:52+00:00
    tr.type_index = default_transition_type_;
  }

  // Extend the transitions using the future specification.
  if (!ExtendTransitions()) return false;

  // Ensure that there is always a transition in the second half of the
  // time line (the first half is handled above) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  const Transition& last(transitions_.back());
  if (last.unix_time < 0) {
    const std::uint_fast8_t type_index = last.type_index;
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = 2147483647;  // 2038-01-19T03:14:07+00:00
    tr.type_index = type_index;
  }

  // Compute the local civil time for each transition and the preceding
  // second. These will be used for reverse conversions in MakeTime().
  const TransitionType* ttp = &transition_types_[default_transition_type_];
  for (std::size_t i = 0; i != transitions_.size(); ++i) {
    Transition& tr(transitions_[i]);
    tr.prev_civil_sec = LocalTime(tr.unix_time, *ttp).cs - 1;
    ttp = &transition_types_[tr.type_index];
    tr.civil_sec = LocalTime(tr.unix_time, *ttp).cs;
    if (i != 0) {
      // Check that the transitions are ordered by civil time. Essentially
      // this means that an offset change cannot cross another such change.
      // No one does this in practice, and we depend on it in MakeTime().
      if (!Transition::ByCivilTime()(transitions_[i - 1], tr))
        return false;  // out of order
    }
  }

  // Compute the maximum/minimum civil times that can be converted to a
  // time_point<seconds> for each of the zone's transition types.
  for (auto& tt : transition_types_) {
    tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
    tt.civil_min = LocalTime(seconds::min().count(), tt).cs;
  }

  transitions_.shrink_to_fit();
  return true;
}